

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::TypedConfigurations
          (TypedConfigurations *this,Configurations *configurations,
          LogStreamsReferenceMap *logStreamsReference)

{
  LogStreamsReferenceMap *logStreamsReference_local;
  Configurations *configurations_local;
  TypedConfigurations *this_local;
  
  threading::ThreadSafe::ThreadSafe(&this->super_ThreadSafe);
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00188418;
  std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map(&this->m_enabledMap);
  std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map(&this->m_toFileMap);
  std::
  map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_filenameMap);
  std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map(&this->m_toStandardOutputMap);
  std::
  map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  ::map(&this->m_logFormatMap);
  std::
  map<el::Level,_el::base::MillisecondsWidth,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::MillisecondsWidth>_>_>
  ::map(&this->m_millisecondsWidthMap);
  std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map(&this->m_performanceTrackingMap);
  std::
  map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::map(&this->m_fileStreamMap);
  std::
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::map(&this->m_maxLogFileSizeMap);
  std::
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::map(&this->m_logFlushThresholdMap);
  this->m_configurations = configurations;
  this->m_logStreamsReference = logStreamsReference;
  build(this,this->m_configurations);
  return;
}

Assistant:

TypedConfigurations(Configurations* configurations, base::LogStreamsReferenceMap* logStreamsReference) {
        m_configurations = configurations;
        m_logStreamsReference = logStreamsReference;
        build(m_configurations);
    }